

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O3

FT_Error FT_Bitmap_Blend(FT_Library library,FT_Bitmap *source_,FT_Vector source_offset_,
                        FT_Bitmap *target,FT_Vector *atarget_offset,FT_Color color)

{
  byte bVar1;
  undefined4 in_EAX;
  int iVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  byte *pbVar12;
  int *piVar13;
  byte *pbVar14;
  ulong uVar15;
  byte *pbVar16;
  ulong uVar17;
  FT_Bitmap *target_00;
  undefined1 auVar18 [16];
  FT_Error error;
  FT_Error local_ec;
  undefined8 local_e8;
  byte *local_e0;
  byte *local_d8;
  int *local_d0;
  ulong local_c8;
  byte *local_c0;
  byte *local_b8;
  ulong local_b0;
  undefined8 local_a8;
  ulong local_a0;
  int local_94;
  uchar *local_90;
  ulong local_88;
  long local_80;
  uint *local_78;
  byte *local_70;
  byte *local_68;
  uchar *local_60;
  FT_Bitmap local_58;
  
  local_ec = 0;
  auVar18._0_4_ = -(uint)(library == (FT_Library)0x0);
  auVar18._4_4_ = -(uint)(target == (FT_Bitmap *)0x0);
  auVar18._8_4_ = -(uint)(source_ == (FT_Bitmap *)0x0);
  auVar18._12_4_ = -(uint)(atarget_offset == (FT_Vector *)0x0);
  iVar2 = movmskps(in_EAX,auVar18);
  if (iVar2 == 0) {
    piVar13 = &source_->pitch;
    local_a8 = library->memory;
    bVar1 = target->pixel_mode;
    if (bVar1 == 0) {
      if (source_->pixel_mode == '\0') {
        return 0;
      }
    }
    else {
      if (bVar1 != 7) {
        return 6;
      }
      if (target->buffer == (uchar *)0x0) {
        return 6;
      }
      if (source_->pixel_mode == '\0') {
        return 0;
      }
      if ((target->pitch ^ *piVar13) < 0) {
        return 6;
      }
    }
    local_60 = &source_->pixel_mode;
    local_78 = &source_->width;
    if (*local_78 == 0) {
      return 0;
    }
    if (source_->rows == 0) {
      return 0;
    }
    uVar4 = source_offset_.y & 0xffffffffffffffc0;
    uVar5 = (ulong)(source_->rows << 6);
    if ((long)(uVar5 + 0x8000000000000040) <= (long)uVar4) {
      uVar17 = source_offset_.x & 0xffffffffffffffc0;
      uVar15 = (ulong)(*local_78 << 6);
      if ((long)uVar17 <= (long)(0x7fffffffffffffbf - uVar15)) {
        uVar6 = target->width;
        local_e8 = CONCAT44(local_e8._4_4_,uVar6);
        if ((uVar6 == 0) || (target->rows == 0)) {
          local_d8 = (byte *)0x7fffffffffffffff;
          local_a0 = 0x8000000000000000;
          local_c0 = (byte *)0x8000000000000000;
          local_c8 = 0x7fffffffffffffff;
LAB_0026d2cf:
          local_68 = (byte *)(uVar4 - uVar5);
          pbVar12 = (byte *)(uVar15 + uVar17);
          local_b0 = local_c8;
          if ((long)uVar17 < (long)local_c8) {
            local_b0 = uVar17;
          }
          local_b8 = local_d8;
          if ((long)local_68 < (long)local_d8) {
            local_b8 = local_68;
          }
          if ((long)pbVar12 <= (long)local_c0) {
            pbVar12 = local_c0;
          }
          if ((long)local_a0 < (long)uVar4) {
            local_a0 = uVar4;
          }
          local_e0 = (byte *)((long)pbVar12 - local_b0 >> 6);
          uVar8 = (uint)local_e0;
          if (uVar8 == 0) {
            return 0;
          }
          local_a0 = local_a0 - (long)local_b8;
          uVar9 = (uint)(local_a0 >> 6);
          if (uVar9 == 0) {
            return 0;
          }
          pbVar12 = local_d8;
          uVar4 = local_c8;
          if ((uVar6 != 0) && (target->rows != 0)) {
            pbVar12 = local_d8 + -(long)local_b8;
            uVar4 = local_c8 - local_b0;
          }
          if (bVar1 == 0) {
            target->width = uVar8;
            target->rows = uVar9;
            target->pixel_mode = '\a';
            iVar2 = uVar8 * 4;
            target->pitch = iVar2;
            target->num_grays = 0x100;
            if (SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)iVar2),0)
                < (long)(int)uVar9) {
              return 6;
            }
            local_d0 = piVar13;
            puVar3 = (uchar *)ft_mem_alloc(local_a8,(long)(int)(iVar2 * uVar9),&local_ec);
            target->buffer = puVar3;
            piVar13 = local_d0;
            if (local_ec != 0) {
              return local_ec;
            }
          }
          else {
            local_d8 = pbVar12;
            if ((uVar6 != uVar8) || (local_c8 = uVar4, target->rows != uVar9)) {
              iVar2 = target->pitch;
              iVar10 = -iVar2;
              if (0 < iVar2) {
                iVar10 = iVar2;
              }
              local_e8 = CONCAT44(local_e8._4_4_,iVar10);
              local_94 = uVar8 * 4;
              local_80 = (long)local_94;
              if (SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_80),0) <
                  (long)(int)uVar9) {
                return 6;
              }
              local_d0 = piVar13;
              local_c8 = uVar4;
              local_88 = local_a0 >> 6;
              local_90 = (uchar *)ft_mem_alloc(local_a8,(long)(int)(local_94 * uVar9),&local_ec);
              if (local_ec != 0) {
                return local_ec;
              }
              if (-1 < target->pitch) {
                iVar2 = target->rows * (int)local_e8;
                if (0 < iVar2) {
                  pbVar12 = target->buffer;
                  local_70 = pbVar12 + iVar2;
                  pbVar7 = local_90 +
                           ((long)local_c8 >> 4 & 0xfffffffffffffffcU) +
                           ((local_88 & 0xffffffff) - (((long)local_d8 >> 6) + (ulong)target->rows))
                           * local_80;
                  local_e8 = local_e8 & 0xffffffff;
                  do {
                    local_d8 = pbVar7;
                    local_c0 = pbVar12;
                    memcpy(pbVar7,pbVar12,local_e8);
                    pbVar12 = local_c0 + local_e8;
                    pbVar7 = local_d8 + local_80;
                  } while (pbVar12 < local_70);
                }
              }
              ft_mem_free(local_a8,target->buffer);
              target->width = (uint)local_e0;
              target->rows = (uint)local_88;
              iVar2 = -local_94;
              if (-1 < target->pitch) {
                iVar2 = local_94;
              }
              target->pitch = iVar2;
              target->buffer = local_90;
              piVar13 = local_d0;
            }
          }
          local_c8 = CONCAT71(local_c8._1_7_,*local_60);
          if (*local_60 == '\x02') {
            target_00 = source_;
            local_d0 = piVar13;
          }
          else {
            target_00 = &local_58;
            local_58.buffer = (uchar *)0x0;
            local_58.num_grays = 0;
            local_58.pixel_mode = '\0';
            local_58.palette_mode = '\0';
            local_58._28_4_ = 0;
            local_58.rows = 0;
            local_58.width = 0;
            local_58.pitch = 0;
            local_58._12_4_ = 0;
            local_58.palette = (void *)0x0;
            local_ec = FT_Bitmap_Convert(library,source_,target_00,1);
            if (local_ec != 0) {
              if (bVar1 == 0) {
                ft_mem_free(library->memory,target->buffer);
                target->buffer = (uchar *)0x0;
                target->num_grays = 0;
                target->pixel_mode = '\0';
                target->palette_mode = '\0';
                *(undefined4 *)&target->field_0x1c = 0;
                target->rows = 0;
                target->width = 0;
                *(undefined8 *)&target->pitch = 0;
                target->palette = (void *)0x0;
                return local_ec;
              }
              return local_ec;
            }
            local_d0 = &local_58.pitch;
            local_78 = &local_58.width;
            local_ec = 0;
          }
          local_a8 = (FT_Memory)CONCAT44(local_a8._4_4_,(uint)bVar1);
          uVar4 = (ulong)target->pitch;
          if (-1 < (long)uVar4) {
            iVar2 = *local_d0;
            iVar10 = iVar2 * target_00->rows;
            if (0 < iVar10) {
              pbVar12 = target_00->buffer;
              local_d8 = pbVar12 + iVar10;
              pbVar7 = target->buffer +
                       ((long)(uVar17 - local_b0) >> 4 & 0xfffffffffffffffcU) +
                       ((ulong)target->rows -
                       (((long)local_68 - (long)local_b8 >> 6) + (ulong)target_00->rows)) * uVar4;
              local_e8 = CONCAT44(local_e8._4_4_,(uint)color >> 8) & 0xffffffff000000ff;
              do {
                local_e0 = (byte *)(ulong)*local_78;
                if (local_e0 != (byte *)0x0) {
                  local_e0 = local_e0 + (long)pbVar12;
                  pbVar14 = pbVar7;
                  pbVar16 = pbVar12;
                  do {
                    uVar6 = (uint)*pbVar16 * ((uint)color >> 0x18);
                    uVar8 = uVar6 / 0xff;
                    iVar2 = 0xff - uVar8;
                    *pbVar14 = (char)((uint)*pbVar14 * iVar2 * 0x8081 >> 0x17) +
                               (char)((ulong)(uVar8 * ((uint)color & 0xff)) * 0x1010102 >> 0x20);
                    pbVar14[1] = (char)((uint)pbVar14[1] * iVar2 * 0x8081 >> 0x17) +
                                 (char)((ulong)(uVar8 * (int)local_e8) * 0x1010102 >> 0x20);
                    pbVar14[2] = (char)((uint)pbVar14[2] * iVar2 * 0x8081 >> 0x17) +
                                 (char)((ulong)(uVar8 * ((uint)color >> 0x10 & 0xff)) * 0x1010102 >>
                                       0x20);
                    pbVar14[3] = (char)((uint)pbVar14[3] * iVar2 * 0x8081 >> 0x17) +
                                 (char)((ulong)uVar6 * 0x1010102 >> 0x20);
                    pbVar16 = pbVar16 + 1;
                    pbVar14 = pbVar14 + 4;
                  } while (pbVar16 < local_e0);
                  iVar2 = *local_d0;
                  uVar4 = (ulong)(uint)target->pitch;
                  local_c0 = pbVar12;
                }
                pbVar12 = pbVar12 + iVar2;
                pbVar7 = pbVar7 + (int)uVar4;
              } while (pbVar12 < local_d8);
            }
          }
          atarget_offset->x = local_b0;
          atarget_offset->y = (FT_Pos)(local_b8 + ((uint)local_a0 & 0xffffffc0));
          if ((bVar1 == 0) && (local_ec != 0)) {
            ft_mem_free(library->memory,target->buffer);
            target->buffer = (uchar *)0x0;
            target->num_grays = 0;
            target->pixel_mode = '\0';
            target->palette_mode = '\0';
            *(undefined4 *)&target->field_0x1c = 0;
            target->rows = 0;
            target->width = 0;
            *(undefined8 *)&target->pitch = 0;
            target->palette = (void *)0x0;
          }
          if ((char)local_c8 != '\x02') {
            ft_mem_free(library->memory,local_58.buffer);
            return local_ec;
          }
          return local_ec;
        }
        local_a0 = atarget_offset->y & 0xffffffffffffffc0;
        uVar11 = (ulong)(target->rows << 6);
        if ((long)(uVar11 + 0x8000000000000000) <= (long)local_a0) {
          local_c8 = atarget_offset->x & 0xffffffffffffffc0;
          if ((long)local_c8 <= (long)((ulong)(uVar6 << 6) ^ 0x7fffffffffffffff)) {
            local_d8 = (byte *)(local_a0 - uVar11);
            local_c0 = (byte *)((uVar6 << 6) + local_c8);
            goto LAB_0026d2cf;
          }
        }
      }
    }
  }
  return 6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Blend( FT_Library        library,
                   const FT_Bitmap*  source_,
                   const FT_Vector   source_offset_,
                   FT_Bitmap*        target,
                   FT_Vector        *atarget_offset,
                   FT_Color          color )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Memory  memory;

    FT_Bitmap         source_bitmap;
    const FT_Bitmap*  source;

    FT_Vector  source_offset;
    FT_Vector  target_offset;

    FT_Bool  free_source_bitmap          = 0;
    FT_Bool  free_target_bitmap_on_error = 0;

    FT_Pos  source_llx, source_lly, source_urx, source_ury;
    FT_Pos  target_llx, target_lly, target_urx, target_ury;
    FT_Pos  final_llx, final_lly, final_urx, final_ury;

    unsigned int  final_rows, final_width;
    long          x, y;


    if ( !library || !target || !source_ || !atarget_offset )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    if ( !( target->pixel_mode == FT_PIXEL_MODE_NONE     ||
            ( target->pixel_mode == FT_PIXEL_MODE_BGRA &&
              target->buffer                           ) ) )
      return FT_THROW( Invalid_Argument );

    if ( source_->pixel_mode == FT_PIXEL_MODE_NONE )
      return FT_Err_Ok;               /* nothing to do */

    /* pitches must have the same sign */
    if ( target->pixel_mode == FT_PIXEL_MODE_BGRA &&
         ( source_->pitch ^ target->pitch ) < 0   )
      return FT_THROW( Invalid_Argument );

    if ( !( source_->width && source_->rows ) )
      return FT_Err_Ok;               /* nothing to do */

    /* assure integer pixel offsets */
    source_offset.x = FT_PIX_FLOOR( source_offset_.x );
    source_offset.y = FT_PIX_FLOOR( source_offset_.y );
    target_offset.x = FT_PIX_FLOOR( atarget_offset->x );
    target_offset.y = FT_PIX_FLOOR( atarget_offset->y );

    /* get source bitmap dimensions */
    source_llx = source_offset.x;
    if ( FT_LONG_MIN + (FT_Pos)( source_->rows << 6 ) + 64 > source_offset.y )
    {
      FT_TRACE5((
        "FT_Bitmap_Blend: y coordinate overflow in source bitmap\n" ));
      return FT_THROW( Invalid_Argument );
    }
    source_lly = source_offset.y - ( source_->rows << 6 );

    if ( FT_LONG_MAX - (FT_Pos)( source_->width << 6 ) - 64 < source_llx )
    {
      FT_TRACE5((
        "FT_Bitmap_Blend: x coordinate overflow in source bitmap\n" ));
      return FT_THROW( Invalid_Argument );
    }
    source_urx = source_llx + ( source_->width << 6 );
    source_ury = source_offset.y;

    /* get target bitmap dimensions */
    if ( target->width && target->rows )
    {
      target_llx = target_offset.x;
      if ( FT_LONG_MIN + (FT_Pos)( target->rows << 6 ) > target_offset.y )
      {
        FT_TRACE5((
          "FT_Bitmap_Blend: y coordinate overflow in target bitmap\n" ));
        return FT_THROW( Invalid_Argument );
      }
      target_lly = target_offset.y - ( target->rows << 6 );

      if ( FT_LONG_MAX - (FT_Pos)( target->width << 6 ) < target_llx )
      {
        FT_TRACE5((
          "FT_Bitmap_Blend: x coordinate overflow in target bitmap\n" ));
        return FT_THROW( Invalid_Argument );
      }
      target_urx = target_llx + ( target->width << 6 );
      target_ury = target_offset.y;
    }
    else
    {
      target_llx = FT_LONG_MAX;
      target_lly = FT_LONG_MAX;
      target_urx = FT_LONG_MIN;
      target_ury = FT_LONG_MIN;
    }

    /* compute final bitmap dimensions */
    final_llx = FT_MIN( source_llx, target_llx );
    final_lly = FT_MIN( source_lly, target_lly );
    final_urx = FT_MAX( source_urx, target_urx );
    final_ury = FT_MAX( source_ury, target_ury );

    final_width = ( final_urx - final_llx ) >> 6;
    final_rows  = ( final_ury - final_lly ) >> 6;

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE5(( "FT_Bitmap_Blend:\n" ));
    FT_TRACE5(( "  source bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
      source_llx / 64, source_lly / 64,
      source_urx / 64, source_ury / 64,
      source_->width, source_->rows ));

    if ( target->width && target->rows )
      FT_TRACE5(( "  target bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
        target_llx / 64, target_lly / 64,
        target_urx / 64, target_ury / 64,
        target->width, target->rows ));
    else
      FT_TRACE5(( "  target bitmap: empty\n" ));

    if ( final_width && final_rows )
      FT_TRACE5(( "  final bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
        final_llx / 64, final_lly / 64,
        final_urx / 64, final_ury / 64,
        final_width, final_rows ));
    else
      FT_TRACE5(( "  final bitmap: empty\n" ));
#endif /* FT_DEBUG_LEVEL_TRACE */

    if ( !( final_width && final_rows ) )
      return FT_Err_Ok;               /* nothing to do */

    /* for blending, set offset vector of final bitmap */
    /* temporarily to (0,0)                            */
    source_llx -= final_llx;
    source_lly -= final_lly;

    if ( target->width && target->rows )
    {
      target_llx -= final_llx;
      target_lly -= final_lly;
    }

    /* set up target bitmap */
    if ( target->pixel_mode == FT_PIXEL_MODE_NONE )
    {
      /* create new empty bitmap */
      target->width      = final_width;
      target->rows       = final_rows;
      target->pixel_mode = FT_PIXEL_MODE_BGRA;
      target->pitch      = (int)final_width * 4;
      target->num_grays  = 256;

      if ( FT_LONG_MAX / target->pitch < (int)target->rows )
      {
        FT_TRACE5(( "FT_Blend_Bitmap: target bitmap too large (%d x %d)\n",
                     final_width, final_rows ));
        return FT_THROW( Invalid_Argument );
      }

      if ( FT_ALLOC( target->buffer, target->pitch * (int)target->rows ) )
        return error;

      free_target_bitmap_on_error = 1;
    }
    else if ( target->width != final_width ||
              target->rows  != final_rows  )
    {
      /* adjust old bitmap to enlarged size */
      int  pitch, new_pitch;

      unsigned char*  buffer = NULL;


      pitch = target->pitch;

      if ( pitch < 0 )
        pitch = -pitch;

      new_pitch = (int)final_width * 4;

      if ( FT_LONG_MAX / new_pitch < (int)final_rows )
      {
        FT_TRACE5(( "FT_Blend_Bitmap: target bitmap too large (%d x %d)\n",
                     final_width, final_rows ));
        return FT_THROW( Invalid_Argument );
      }

      /* TODO: provide an in-buffer solution for large bitmaps */
      /*       to avoid allocation of a new buffer             */
      if ( FT_ALLOC( buffer, new_pitch * (int)final_rows ) )
        goto Error;

      /* copy data to new buffer */
      x = target_llx >> 6;
      y = target_lly >> 6;

      /* the bitmap flow is from top to bottom, */
      /* but y is measured from bottom to top   */
      if ( target->pitch < 0 )
      {
        /* XXX */
      }
      else
      {
        unsigned char*  p =
          target->buffer;
        unsigned char*  q =
          buffer +
          ( final_rows - y - target->rows ) * new_pitch +
          x * 4;
        unsigned char*  limit_p =
          p + pitch * (int)target->rows;


        while ( p < limit_p )
        {
          FT_MEM_COPY( q, p, pitch );

          p += pitch;
          q += new_pitch;
        }
      }

      FT_FREE( target->buffer );

      target->width = final_width;
      target->rows  = final_rows;

      if ( target->pitch < 0 )
        target->pitch = -new_pitch;
      else
        target->pitch = new_pitch;

      target->buffer = buffer;
    }

    /* adjust source bitmap if necessary */
    if ( source_->pixel_mode != FT_PIXEL_MODE_GRAY )
    {
      FT_Bitmap_Init( &source_bitmap );
      error = FT_Bitmap_Convert( library, source_, &source_bitmap, 1 );
      if ( error )
        goto Error;

      source             = &source_bitmap;
      free_source_bitmap = 1;
    }
    else
      source = source_;

    /* do blending; the code below returns pre-multiplied channels, */
    /* similar to what FreeType gets from `CBDT' tables             */
    x = source_llx >> 6;
    y = source_lly >> 6;

    /* the bitmap flow is from top to bottom, */
    /* but y is measured from bottom to top   */
    if ( target->pitch < 0 )
    {
      /* XXX */
    }
    else
    {
      unsigned char*  p =
        source->buffer;
      unsigned char*  q =
        target->buffer +
        ( target->rows - y - source->rows ) * target->pitch +
        x * 4;
      unsigned char*  limit_p =
        p + source->pitch * (int)source->rows;


      while ( p < limit_p )
      {
        unsigned char*  r       = p;
        unsigned char*  s       = q;
        unsigned char*  limit_r = r + source->width;


        while ( r < limit_r )
        {
          int  aa = *r++;
          int  fa = color.alpha * aa / 255;

          int  fb = color.blue * fa / 255;
          int  fg = color.green * fa / 255;
          int  fr = color.red * fa / 255;

          int  ba2 = 255 - fa;

          int  bb = s[0];
          int  bg = s[1];
          int  br = s[2];
          int  ba = s[3];


          *s++ = (unsigned char)( bb * ba2 / 255 + fb );
          *s++ = (unsigned char)( bg * ba2 / 255 + fg );
          *s++ = (unsigned char)( br * ba2 / 255 + fr );
          *s++ = (unsigned char)( ba * ba2 / 255 + fa );
        }

        p += source->pitch;
        q += target->pitch;
      }
    }

    atarget_offset->x = final_llx;
    atarget_offset->y = final_lly + ( final_rows << 6 );

  Error:
    if ( error && free_target_bitmap_on_error )
      FT_Bitmap_Done( library, target );

    if ( free_source_bitmap )
      FT_Bitmap_Done( library, &source_bitmap );

    return error;
  }